

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_packet_decoder.c
# Opt level: O1

int pt_pkt_get_sync_offset(pt_packet_decoder *decoder,uint64_t *offset)

{
  int iVar1;
  
  iVar1 = -2;
  if (offset != (uint64_t *)0x0 && decoder != (pt_packet_decoder *)0x0) {
    if (decoder->sync == (uint8_t *)0x0) {
      return -3;
    }
    *offset = (long)decoder->sync - (long)(decoder->config).begin;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int pt_pkt_get_sync_offset(const struct pt_packet_decoder *decoder,
			   uint64_t *offset)
{
	const uint8_t *begin, *sync;

	if (!decoder || !offset)
		return -pte_invalid;

	begin = decoder->config.begin;
	sync = decoder->sync;

	if (!sync)
		return -pte_nosync;

	*offset = (uint64_t) (int64_t) (sync - begin);
	return 0;
}